

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O1

int Acb_NtkCreateNode(Acb_Ntk_t *p,word uTruth,Vec_Int_t *vSupp)

{
  uint uVar1;
  uint iObj;
  int iVar2;
  uint uVar3;
  Vec_Que_t *pVVar4;
  char *pcVar5;
  word *pwVar6;
  float *pfVar7;
  int iVar8;
  size_t __size;
  
  iVar8 = vSupp->nSize;
  uVar1 = (p->vObjType).nCap;
  iObj = (p->vObjType).nSize;
  if (iObj == uVar1) {
    if ((int)uVar1 < 0x10) {
      pcVar5 = (p->vObjType).pArray;
      if (pcVar5 == (char *)0x0) {
        pcVar5 = (char *)malloc(0x10);
      }
      else {
        pcVar5 = (char *)realloc(pcVar5,0x10);
      }
      (p->vObjType).pArray = pcVar5;
      __size = 0x10;
    }
    else {
      __size = (ulong)uVar1 * 2;
      if ((int)__size <= (int)uVar1) goto LAB_003850f5;
      pcVar5 = (p->vObjType).pArray;
      if (pcVar5 == (char *)0x0) {
        pcVar5 = (char *)malloc(__size);
      }
      else {
        pcVar5 = (char *)realloc(pcVar5,__size);
      }
      (p->vObjType).pArray = pcVar5;
    }
    (p->vObjType).nCap = (int)__size;
  }
LAB_003850f5:
  iVar2 = (p->vObjType).nSize;
  (p->vObjType).nSize = iVar2 + 1;
  (p->vObjType).pArray[iVar2] = 'K';
  if ((int)iObj < 1) {
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                  ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
  }
  if ((p->vObjType).nSize <= (int)iObj) {
LAB_003854a0:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                  ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
  }
  iVar8 = iVar8 + (uint)((p->vObjType).pArray[iObj] == '\x06');
  if (iVar8 <= p->nFaninMax) {
    iVar8 = p->nFaninMax;
  }
  Vec_IntPush(&p->vObjFans,(p->vFanSto).nSize);
  Vec_IntPush(&p->vFanSto,0);
  if (0 < iVar8) {
    do {
      Vec_IntPush(&p->vFanSto,-1);
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
  }
  if ((p->vObjType).nSize <= (int)iObj) goto LAB_003854a0;
  if ((p->vObjType).pArray[iObj] == '\x06') {
    __assert_fail("!Acb_ObjIsBox(p, iObj) || nFons > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                  ,0x1e7,"int Acb_ObjAlloc(Acb_Ntk_t *, Acb_ObjType_t, int, int)");
  }
  if (0 < (p->vObjCopy).nSize) {
    Vec_IntPush(&p->vObjCopy,-1);
  }
  if (0 < (p->vObjFunc).nSize) {
    Vec_IntPush(&p->vObjFunc,-1);
  }
  if (0 < (p->vObjWeight).nSize) {
    Vec_IntPush(&p->vObjWeight,0);
  }
  uVar1 = (p->vObjTruth).nSize;
  if (0 < (int)uVar1) {
    uVar3 = (p->vObjTruth).nCap;
    if (uVar1 == uVar3) {
      if ((int)uVar3 < 0x10) {
        pwVar6 = (p->vObjTruth).pArray;
        if (pwVar6 == (word *)0x0) {
          pwVar6 = (word *)malloc(0x80);
        }
        else {
          pwVar6 = (word *)realloc(pwVar6,0x80);
        }
        (p->vObjTruth).pArray = pwVar6;
        iVar8 = 0x10;
      }
      else {
        iVar8 = uVar3 * 2;
        if (iVar8 <= (int)uVar3) goto LAB_00385267;
        pwVar6 = (p->vObjTruth).pArray;
        if (pwVar6 == (word *)0x0) {
          pwVar6 = (word *)malloc((ulong)uVar3 << 4);
        }
        else {
          pwVar6 = (word *)realloc(pwVar6,(ulong)uVar3 << 4);
        }
        (p->vObjTruth).pArray = pwVar6;
      }
      if (pwVar6 == (word *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1e4,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
      }
      (p->vObjTruth).nCap = iVar8;
    }
LAB_00385267:
    iVar8 = (p->vObjTruth).nSize;
    (p->vObjTruth).nSize = iVar8 + 1;
    (p->vObjTruth).pArray[iVar8] = 0;
  }
  if (0 < (p->vObjName).nSize) {
    Vec_IntPush(&p->vObjName,0);
  }
  if (0 < (p->vObjRange).nSize) {
    Vec_IntPush(&p->vObjRange,0);
  }
  if (0 < (p->vObjTrav).nSize) {
    Vec_IntPush(&p->vObjTrav,0);
  }
  if (0 < (p->vObjAttr).nSize) {
    Vec_IntPush(&p->vObjAttr,0);
  }
  if (0 < (p->vLevelD).nSize) {
    Vec_IntPush(&p->vLevelD,0);
  }
  if (0 < (p->vLevelR).nSize) {
    Vec_IntPush(&p->vLevelR,0);
  }
  if (0 < (p->vPathD).nSize) {
    Vec_IntPush(&p->vPathD,0);
  }
  if (0 < (p->vPathR).nSize) {
    Vec_IntPush(&p->vPathR,0);
  }
  uVar1 = (p->vCounts).nSize;
  if ((int)uVar1 < 1) goto LAB_003853f3;
  uVar3 = (p->vCounts).nCap;
  if (uVar1 == uVar3) {
    if ((int)uVar3 < 0x10) {
      pfVar7 = (p->vCounts).pArray;
      if (pfVar7 == (float *)0x0) {
        pfVar7 = (float *)malloc(0x40);
      }
      else {
        pfVar7 = (float *)realloc(pfVar7,0x40);
      }
      (p->vCounts).pArray = pfVar7;
      iVar8 = 0x10;
    }
    else {
      iVar8 = uVar3 * 2;
      if (iVar8 <= (int)uVar3) goto LAB_003853d4;
      pfVar7 = (p->vCounts).pArray;
      if (pfVar7 == (float *)0x0) {
        pfVar7 = (float *)malloc((ulong)uVar3 << 3);
      }
      else {
        pfVar7 = (float *)realloc(pfVar7,(ulong)uVar3 << 3);
      }
      (p->vCounts).pArray = pfVar7;
    }
    (p->vCounts).nCap = iVar8;
  }
LAB_003853d4:
  iVar8 = (p->vCounts).nSize;
  (p->vCounts).nSize = iVar8 + 1;
  (p->vCounts).pArray[iVar8] = 0.0;
LAB_003853f3:
  if (0 < (p->vFanouts).nSize) {
    Vec_WecPushLevel(&p->vFanouts);
  }
  if (0 < (p->vCnfs).nSize) {
    Vec_WecPushLevel(&p->vCnfs);
  }
  pVVar4 = p->vQue;
  if (pVVar4 != (Vec_Que_t *)0x0) {
    if (pVVar4->pCostsFlt != (float **)0x0) {
      __assert_fail("p->pCostsFlt == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecQue.h"
                    ,0x61,"void Vec_QueSetPriority(Vec_Que_t *, float **)");
    }
    pVVar4->pCostsFlt = &(p->vCounts).pArray;
  }
  iVar8 = (p->vObjTruth).nSize;
  if (iVar8 < 1) {
    __assert_fail("Acb_NtkHasObjTruths(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                  ,0x10b,"word Acb_ObjTruth(Acb_Ntk_t *, int)");
  }
  if (iVar8 <= (int)iObj) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                  ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
  }
  pwVar6 = (p->vObjTruth).pArray;
  if (pwVar6[iObj] == 0) {
    pwVar6[iObj] = uTruth;
    Acb_ObjAddFanins(p,iObj,vSupp);
    Acb_ObjAddFaninFanout(p,iObj);
    Acb_ObjComputeLevelD(p,iObj);
    return iObj;
  }
  __assert_fail("Acb_ObjTruth(p, i) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                ,0x11d,"void Acb_ObjSetTruth(Acb_Ntk_t *, int, word)");
}

Assistant:

int Acb_NtkCreateNode( Acb_Ntk_t * p, word uTruth, Vec_Int_t * vSupp )
{
    int Pivot = Acb_ObjAlloc( p, ABC_OPER_LUT, Vec_IntSize(vSupp), 0 );
    Acb_ObjSetTruth( p, Pivot, uTruth );
    Acb_ObjAddFanins( p, Pivot, vSupp );
    Acb_ObjAddFaninFanout( p, Pivot );
    Acb_ObjComputeLevelD( p, Pivot );
    return Pivot;
}